

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O3

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
::InitNonPeriodic(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpAId>_>
                  *this)

{
  _Rb_tree_header *__last;
  const_iterator __first;
  pair<std::_Rb_tree_iterator<float>,_bool> pVar1;
  BreakpointList bp_default;
  set<float,_std::less<float>,_std::allocator<float>_> bpl_set;
  float local_5c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  long local_48;
  _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_> local_40;
  
  this->laPrm_->fUsePeriod = false;
  (*this->_vptr_BasicPLApproximator[8])(&local_58,this);
  std::set<float,std::less<float>,std::allocator<float>>::
  set<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((set<float,std::less<float>,std::allocator<float>> *)&local_40,local_58,local_50);
  local_5c = (float)this->lbx_;
  pVar1 = std::
          _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
          _M_insert_unique<float>(&local_40,&local_5c);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  _M_erase_aux(&local_40,(const_iterator)local_40._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Base_ptr)pVar1.first._M_node);
  local_5c = (float)this->ubx_;
  pVar1 = std::
          _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
          _M_insert_unique<float>(&local_40,&local_5c);
  __first._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar1.first._M_node._M_node);
  __last = &local_40._M_impl.super__Rb_tree_header;
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  _M_erase_aux(&local_40,__first,(const_iterator)__last);
  std::vector<double,std::allocator<double>>::_M_assign_aux<std::_Rb_tree_const_iterator<float>>
            ((vector<double,std::allocator<double>> *)&this->breakpoints_,
             local_40._M_impl.super__Rb_tree_header._M_header._M_left,__last);
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
  ~_Rb_tree(&local_40);
  if (local_58._M_current != (double *)0x0) {
    operator_delete(local_58._M_current,local_48 - (long)local_58._M_current);
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::InitNonPeriodic() {
  // If using breakpoints, need to narrow / exclude subinterval
  // according to lbx() / ubx()
  laPrm_.fUsePeriod = false;
  auto bp_default = GetDefaultBreakpoints();
  std::set<float> bpl_set(bp_default.begin(), bp_default.end());
  auto it = bpl_set.insert(lbx()).first;
  bpl_set.erase(bpl_set.begin(), it);      // remove points before lbx()
  it = bpl_set.insert(ubx()).first;
  bpl_set.erase(++it, bpl_set.end());      // remove points after ubx()
  breakpoints_.assign(bpl_set.begin(), bpl_set.end());
  assert(breakpoints_.size() >= 2);
}